

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageRectangle(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  uint uVar1;
  bool bVar2;
  int x2_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  int y;
  int iVar6;
  int x1_00;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar1 = im->thick;
  if ((x1 == x2) && (uVar1 == 1 && y1 == y2)) {
    gdImageSetPixel(im,x1,y1,color);
    return;
  }
  iVar9 = y1;
  if (y1 < y2) {
    iVar9 = y2;
  }
  iVar8 = y1;
  if (y2 < y1) {
    iVar8 = y2;
  }
  x2_00 = x1;
  if (x1 < x2) {
    x2_00 = x2;
  }
  x1_00 = x1;
  if (x2 < x1) {
    x1_00 = x2;
  }
  if ((int)uVar1 < 2) {
    if (x1 != x2 && y2 != y1) {
      gdImageLine(im,x1_00,iVar8,x2_00,iVar8,color);
      gdImageLine(im,x1_00,iVar9,x2_00,iVar9,color);
      iVar8 = iVar8 + 1;
      iVar9 = iVar9 + -1;
      gdImageLine(im,x1_00,iVar8,x1_00,iVar9,color);
      x1_00 = x2_00;
    }
    gdImageLine(im,x1_00,iVar8,x2_00,iVar9,color);
    return;
  }
  uVar3 = uVar1 >> 1;
  iVar4 = x1_00 - uVar3;
  iVar5 = uVar3 + x2_00;
  y = uVar1 + (iVar8 - uVar3);
  iVar7 = y;
  do {
    iVar7 = iVar7 + -1;
    iVar10 = (((uVar1 & 0xfffffffe) + x2_00) - x1_00) + 1;
    iVar6 = iVar4;
    if (iVar4 <= iVar5) {
      do {
        gdImageSetPixel(im,iVar6,iVar7,color);
        iVar10 = iVar10 + -1;
        iVar6 = iVar6 + 1;
      } while (iVar10 != 0);
    }
  } while ((int)(iVar8 - uVar3) < iVar7);
  iVar7 = (iVar9 + uVar3) - uVar1;
  iVar8 = iVar7;
  do {
    iVar8 = iVar8 + 1;
    iVar10 = ((x2_00 + uVar3 * 2) - x1_00) + 1;
    iVar6 = iVar4;
    if (iVar4 <= iVar5) {
      do {
        gdImageSetPixel(im,iVar6,iVar8,color);
        iVar10 = iVar10 + -1;
        iVar6 = iVar6 + 1;
      } while (iVar10 != 0);
    }
  } while (iVar8 < (int)(iVar9 + uVar3));
  if (y <= iVar7) {
    iVar9 = iVar4;
    iVar8 = y;
    do {
      do {
        gdImageSetPixel(im,iVar9,iVar8,color);
        bVar2 = iVar9 < (int)(iVar4 + uVar1);
        iVar9 = iVar9 + 1;
      } while (bVar2);
      bVar2 = iVar8 < iVar7;
      iVar9 = iVar4;
      iVar8 = iVar8 + 1;
    } while (bVar2);
    if (y <= iVar7) {
      do {
        iVar9 = -uVar1;
        if ((int)(~uVar1 + iVar5) < iVar5) {
          do {
            gdImageSetPixel(im,iVar5 + iVar9,y,color);
            iVar9 = iVar9 + 1;
          } while (iVar9 != 1);
        }
        bVar2 = y < iVar7;
        y = y + 1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageRectangle (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int thick = im->thick;

	if (x1 == x2 && y1 == y2 && thick == 1) {
		gdImageSetPixel(im, x1, y1, color);
		return;
	}

	if (y2 < y1) {
		int t = y1;
		y1 = y2;
		y2 = t;
	}

	if (x2 < x1) {
		int t = x1;
		x1 = x2;
		x2 = t;
	}

	if (thick > 1) {
		int cx, cy, x1ul, y1ul, x2lr, y2lr;
		int half = thick >> 1;
		x1ul = x1 - half;
		y1ul = y1 - half;

		x2lr = x2 + half;
		y2lr = y2 + half;

		cy = y1ul + thick;
		while (cy-- > y1ul) {
			cx = x1ul - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y2lr - thick;
		while (cy++ < y2lr) {
			cx = x1ul - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y1ul + thick - 1;
		while (cy++ < y2lr -thick) {
			cx = x1ul - 1;
			while (cx++ < x1ul + thick) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		cy = y1ul + thick - 1;
		while (cy++ < y2lr -thick) {
			cx = x2lr - thick - 1;
			while (cx++ < x2lr) {
				gdImageSetPixel(im, cx, cy, color);
			}
		}

		return;
	} else {
		if (x1 == x2 || y1 == y2) {
			gdImageLine(im, x1, y1, x2, y2, color);
		} else {
			gdImageLine(im, x1, y1, x2, y1, color);
			gdImageLine(im, x1, y2, x2, y2, color);
			gdImageLine(im, x1, y1 + 1, x1, y2 - 1, color);
			gdImageLine(im, x2, y1 + 1, x2, y2 - 1, color);
		}
	}
}